

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O1

int rtr_bgpsec_validate_as_path(rtr_bgpsec *data,spki_table *table)

{
  ushort uVar1;
  undefined2 uVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  stream *s;
  rtr_signature_seg *prVar6;
  uint8_t *buff;
  uint uVar7;
  char *frmt;
  ulong uVar8;
  ulong uVar9;
  rtr_signature_seg *sig;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  uint router_keys_len;
  spki_record *tmp_key;
  uchar *hash_result;
  uint local_4c;
  spki_record *local_48;
  uchar *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (table == (spki_table *)0x0) {
    lrtr_dbg("BGPSEC: TRYING TO VALIDATE A, BUT NO SPKI TABLE INITIALIZED");
    iVar4 = -1;
    goto LAB_001119fe;
  }
  local_40 = (uchar *)0x0;
  local_48 = (spki_record *)0x0;
  iVar4 = -9;
  if ((((data == (rtr_bgpsec *)0x0) || (data->path == (rtr_secure_path_seg *)0x0)) ||
      (data->sigs == (rtr_signature_seg *)0x0)) ||
     (iVar4 = -8, data->sigs_len != (ushort)data->path_len)) goto LAB_001119fe;
  bVar11 = true;
  do {
    bVar3 = bVar11;
    if (data->alg == '\x01') break;
    bVar11 = false;
  } while (bVar3);
  iVar4 = -6;
  if ((!bVar3) || (uVar2 = data->nlri->afi, iVar4 = -7, 1 < (ushort)(uVar2 - 1))) goto LAB_001119fe;
  iVar4 = check_router_keys(data->sigs,table);
  if (iVar4 == 0) {
    uVar8 = 0;
    sVar5 = req_stream_size(data,VALIDATION);
    s = init_stream((uint16_t)sVar5);
    iVar4 = align_byte_sequence(data,s,VALIDATION);
    if (iVar4 == 0) {
      sig = data->sigs;
      get_stream_size(s);
      do {
        prVar6 = sig->next;
        if (sig->next == (rtr_signature_seg *)0x0) {
          prVar6 = sig;
        }
        uVar1 = prVar6->sig_len;
        sVar5 = get_stream_size(s);
        sVar5 = sVar5 - uVar8;
        buff = (uint8_t *)lrtr_malloc(sVar5);
        read_stream_at(buff,s,(uint16_t)uVar8,(uint16_t)sVar5);
        iVar4 = hash_byte_sequence(buff,sVar5,data->alg,&local_40);
        lrtr_free(buff);
        if (iVar4 == 0) {
          local_4c = 0;
          iVar4 = spki_table_search_by_ski(table,sig->ski,&local_48,&local_4c);
          if (iVar4 == -1) {
            iVar4 = -1;
            goto LAB_00111ad7;
          }
          uVar7 = 6;
          if (local_4c == 0) {
            iVar4 = 0;
            bVar11 = true;
          }
          else {
            lVar10 = 0;
            uVar9 = 0;
            do {
              bVar11 = data->alg == '\x01';
              if (!bVar11) {
                iVar4 = -6;
                uVar7 = 2;
                break;
              }
              iVar4 = validate_signature(local_40,sig,(spki_record *)(local_48->ski + lVar10));
              if (iVar4 == 1) {
                iVar4 = 1;
                uVar7 = 6;
                break;
              }
              uVar9 = uVar9 + 1;
              lVar10 = lVar10 + 0x80;
              uVar7 = 6;
            } while (uVar9 < local_4c);
          }
          if (bVar11) {
            lrtr_free(local_40);
            lrtr_free(local_48);
            uVar7 = 0;
            local_40 = (uchar *)0x0;
            local_48 = (spki_record *)0x0;
            sig = sig->next;
          }
        }
        else {
LAB_00111ad7:
          uVar7 = 2;
        }
        if (uVar7 != 0) goto LAB_00111c00;
        uVar8 = (ulong)((int)uVar8 + (uint)uVar1 + 0x1c);
        sVar5 = get_stream_size(s);
        uVar7 = 3;
        if ((sVar5 < uVar8) || (iVar4 != 1)) goto LAB_00111c00;
      } while( true );
    }
  }
  else {
    s = (stream *)0x0;
  }
  goto LAB_00111c0c;
LAB_00111c00:
  if ((uVar7 & 0xfffffffe) != 2) goto LAB_001119fe;
LAB_00111c0c:
  if (local_40 != (uchar *)0x0) {
    lrtr_free(local_40);
  }
  if (local_48 != (spki_record *)0x0) {
    lrtr_free(local_48);
  }
  if (s != (stream *)0x0) {
    free_stream(s);
  }
  if (iVar4 == 1) {
    frmt = "BGPSEC: Validation result for the whole BGPsec_PATH: valid";
  }
  else {
    if (iVar4 != 2) goto LAB_001119fe;
    frmt = "BGPSEC: Validation result for the whole BGPsec_PATH: invalid";
  }
  lrtr_dbg(frmt);
LAB_001119fe:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int rtr_bgpsec_validate_as_path(const struct rtr_bgpsec *data, struct spki_table *table)
{
	if (table == NULL) {
		BGPSEC_DBG1("TRYING TO VALIDATE A, BUT NO SPKI TABLE INITIALIZED");
		return RTR_BGPSEC_ERROR;
	}

	/* The AS path validation result. */
	enum rtr_bgpsec_rtvals retval = 0;

	/* The resulting hash. */
	unsigned char *hash_result = NULL;

	/* A temporare spki record */
	struct spki_record *tmp_key = NULL;

	/* A stream that holds the data that is hashed */
	struct stream *s = NULL;

	/* Total size of required space for the stream */
	unsigned int stream_size = 0;

	/* Use a temp variable in the validation loop since we don't want to
	 * alter data->sigs.
	 */
	struct rtr_signature_seg *tmp_sig = NULL;

	/* Temp variable that holds the signature length of the of the
	 * next signature segment.
	 */
	int tmp_sig_len = 0;

	/* Check, if the parameters are not NULL */
	if (!data || !data->path || !data->sigs || !table)
		return RTR_BGPSEC_INVALID_ARGUMENTS;

	/* Check, if there are as many signature segments as there are
	 * secure path segments
	 */
	if (data->path_len != data->sigs_len)
		return RTR_BGPSEC_WRONG_SEGMENT_COUNT;

	/* Check, if the algorithm suite is supported by RTRlib. */
	if (rtr_bgpsec_has_algorithm_suite(data->alg) == RTR_BGPSEC_ERROR)
		return RTR_BGPSEC_UNSUPPORTED_ALGORITHM_SUITE;

	/* Check, if the AFI is usable with BGPsec */
	if ((data->nlri->afi != BGPSEC_IPV4) && (data->nlri->afi != BGPSEC_IPV6))
		return RTR_BGPSEC_UNSUPPORTED_AFI;

	/* Make sure that all router keys are available. */
	retval = check_router_keys(data->sigs, table);

	if (retval != RTR_BGPSEC_SUCCESS)
		goto err;

	/* Calculate the required stream size and initialize the stream */
	stream_size = req_stream_size(data, VALIDATION);
	s = init_stream(stream_size);

	/* Align the byte sequence and store it in the stream */
	retval = align_byte_sequence(data, s, VALIDATION);

	if (retval != RTR_BGPSEC_SUCCESS)
		goto err;

	/*
	 * The validation is an iterative process. In the first iteration,
	 * the entire byte sequence is hashed to validate the first signature.
	 * In the next iteration, the process is repeated. This time, the
	 * starting position for hashing is moved by an offset to only hash
	 * the data required to validate the next signature. This procedure
	 * is repeated until all signatures are validated or a signature is
	 * determined invalid.
	 *
	 * offset: the current position from where on the bytes should
	 * be hashed.
	 *
	 * next_offset: adds to offset, after the bytes on the
	 * current offset have been processed. next_offset is not
	 * constant and must be calculated each iteration:
	 *
	 * signature length +
	 * SKI size +
	 * sizeof(var that holds signature length) +
	 * sizeof(a secure path segment)
	 *
	 *
	 *  offset
	 * |o++++++++++++++++++++++++++++++++++++++++| bytes
	 *
	 *		offset+=
	 *		new_offset
	 * |------------o++++++++++++++++++++++++++++| bytes
	 *
	 *			    offset+=
	 *			    new_offset
	 * |------------------------o++++++++++++++++| bytes
	 *
	 *
	 * A more detailed view can be found at
	 *https://mailarchive.ietf.org/arch/msg/sidr/8B_e4CNxQCUKeZ_AUzsdnn2f5Mu
	 **/

	/* Set retval to RTR_BGPSEC_VALID so the for-condition does not
	 * fail on the first for loop check.
	 */
	retval = RTR_BGPSEC_VALID;
	tmp_sig = data->sigs;

	for (unsigned int offset = 0, next_offset = 0; offset <= get_stream_size(s) && retval == RTR_BGPSEC_VALID;
	     offset += next_offset) {
		if (tmp_sig->next)
			tmp_sig_len = tmp_sig->next->sig_len;
		else
			tmp_sig_len = tmp_sig->sig_len;

		next_offset = tmp_sig_len + SKI_SIZE + sizeof(tmp_sig->sig_len) + SECURE_PATH_SEG_SIZE;

		/*
		 * From a certain position on, read until the end of the stream.
		 * The starting position is determined by the offset. The end
		 * of the stream is the total length minus the offset.
		 * The curr pointer points to the resulting "sub-stream".
		 * Hacky, could be improved.
		 */
		size_t len = get_stream_size(s) - offset;

		uint8_t *curr = lrtr_malloc(len);

		read_stream_at(curr, s, offset, len);

		retval = hash_byte_sequence(curr, len, data->alg, &hash_result);

		lrtr_free(curr);

		if (retval != RTR_BGPSEC_SUCCESS)
			goto err;

		/* Store all router keys for the given SKI in tmp_key. */
		unsigned int router_keys_len = 0;
		enum spki_rtvals spki_retval =
			spki_table_search_by_ski(table, tmp_sig->ski, &tmp_key, &router_keys_len);
		if (spki_retval == SPKI_ERROR) {
			retval = RTR_BGPSEC_ERROR;
			goto err;
		}

		/* Loop in case there are multiple router keys for one SKI. */
		for (unsigned int j = 0; j < router_keys_len; j++) {
			/* Validate the siganture depending on the algorithm
			 * suite. More if-cases are added with new algorithm
			 * suites.
			 */
			if (data->alg == RTR_BGPSEC_ALGORITHM_SUITE_1) {
				retval = validate_signature(hash_result, tmp_sig, &tmp_key[j]);
			} else {
				retval = RTR_BGPSEC_UNSUPPORTED_ALGORITHM_SUITE;
				goto err;
			}
			/* As soon as one of the router keys produces a valid
			 * result, exit the loop.
			 */
			if (retval == RTR_BGPSEC_VALID)
				break;
		}
		lrtr_free(hash_result);
		lrtr_free(tmp_key);
		hash_result = NULL;
		tmp_key = NULL;
		tmp_sig = tmp_sig->next;
	}

err:
	if (hash_result)
		lrtr_free(hash_result);
	if (tmp_key)
		lrtr_free(tmp_key);
	if (s)
		free_stream(s);

	if (retval == RTR_BGPSEC_VALID)
		BGPSEC_DBG1("Validation result for the whole BGPsec_PATH: valid");
	else if (retval == RTR_BGPSEC_NOT_VALID)
		BGPSEC_DBG1("Validation result for the whole BGPsec_PATH: invalid");

	return retval;
}